

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O2

uint __thiscall
xercesc_4_0::ElemStack::mapPrefixToURI(ElemStack *this,XMLCh *prefixToMap,bool *unknown)

{
  PrefMapElem *pPVar1;
  StackElem *pSVar2;
  uint uVar3;
  XMLSize_t XVar4;
  long lVar5;
  XMLSize_t mapIndex;
  XMLSize_t XVar6;
  bool bVar7;
  
  *unknown = false;
  if ((prefixToMap == (XMLCh *)0x0) || (*prefixToMap == L'\0')) {
    uVar3 = this->fGlobalPoolId;
  }
  else {
    uVar3 = XMLStringPool::getId(&this->fPrefixPool,prefixToMap);
  }
  if (uVar3 != 0) {
    if (uVar3 == this->fXMLPoolId) {
      this = (ElemStack *)&this->fXMLNamespaceId;
      goto LAB_002a458d;
    }
    if (uVar3 == this->fXMLNSPoolId) {
      this = (ElemStack *)&this->fXMLNSNamespaceId;
      goto LAB_002a458d;
    }
    XVar4 = this->fStackTop;
    while (bVar7 = XVar4 != 0, XVar4 = XVar4 - 1, bVar7) {
      lVar5 = -4;
      for (XVar6 = 0; this->fStack[XVar4]->fMapCount != XVar6; XVar6 = XVar6 + 1) {
        pPVar1 = this->fStack[XVar4]->fMap;
        if (pPVar1[XVar6].fPrefId == uVar3) {
          this = (ElemStack *)((long)pPVar1 - lVar5);
          goto LAB_002a458d;
        }
        lVar5 = lVar5 + -8;
      }
    }
    pSVar2 = this->fGlobalNamespaces;
    if (pSVar2 != (StackElem *)0x0) {
      lVar5 = -4;
      for (XVar4 = 0; pSVar2->fMapCount != XVar4; XVar4 = XVar4 + 1) {
        if (pSVar2->fMap[XVar4].fPrefId == uVar3) {
          this = (ElemStack *)((long)pSVar2->fMap - lVar5);
          goto LAB_002a458d;
        }
        lVar5 = lVar5 + -8;
      }
    }
    if (*prefixToMap == L'\0') goto LAB_002a458d;
  }
  *unknown = true;
  this = (ElemStack *)&this->fUnknownNamespaceId;
LAB_002a458d:
  return this->fEmptyNamespaceId;
}

Assistant:

unsigned int ElemStack::mapPrefixToURI( const   XMLCh* const    prefixToMap
                                        ,       bool&           unknown) const
{
    // Assume we find it
    unknown = false;

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = (!prefixToMap || !*prefixToMap)?fGlobalPoolId : fPrefixPool.getId(prefixToMap);
    if (prefixId == 0)
    {
        unknown = true;
        return fUnknownNamespaceId;
    }
    //
    //  Check for the special prefixes 'xml' and 'xmlns' since they cannot
    //  be overridden.
    //
    else if (prefixId == fXMLPoolId)
        return fXMLNamespaceId;
    else if (prefixId == fXMLNSPoolId)
        return fXMLNSNamespaceId;

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    for (XMLSize_t index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // Search the map at this level for the passed prefix
        for (XMLSize_t mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
        {
            if (curRow->fMap[mapIndex].fPrefId == prefixId)
                return curRow->fMap[mapIndex].fURIId;
        }
    }
    //  If the prefix wasn't found, try in the global namespaces
    if(fGlobalNamespaces)
    {
        for (XMLSize_t mapIndex = 0; mapIndex < fGlobalNamespaces->fMapCount; mapIndex++)
        {
            if (fGlobalNamespaces->fMap[mapIndex].fPrefId == prefixId)
                return fGlobalNamespaces->fMap[mapIndex].fURIId;
        }
    }

    //
    //  If the prefix is an empty string, then we will return the special
    //  global namespace id. This can be overridden, but no one has or we
    //  would have not gotten here.
    //
    if (!*prefixToMap)
        return fEmptyNamespaceId;

    // Oh well, don't have a clue so return the unknown id
    unknown = true;
    return fUnknownNamespaceId;
}